

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

bool __thiscall
helics::InputInfo::addData
          (InputInfo *this,GlobalHandle source_id,Time valueTime,uint iteration,
          shared_ptr<const_helics::SmallBuffer> *data)

{
  GlobalHandle id;
  Time recordTime;
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference rhs;
  __shared_ptr *this_00;
  reference rhs_00;
  __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
  sb1;
  value_type *__x;
  baseType in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  SmallBuffer *sb2;
  __shared_ptr *in_R8;
  __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
  prev;
  __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
  m;
  dataRecord newRecord;
  bool found;
  int index;
  vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
  *in_stack_fffffffffffffea8;
  __shared_ptr_access<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffeb0;
  const_iterator in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  SmallBuffer *in_stack_fffffffffffffec8;
  SmallBuffer *in_stack_fffffffffffffed0;
  TimeRepresentation<count_time<9,_long>_> local_d0;
  __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
  local_c8;
  dataRecord *local_c0;
  dataRecord *local_b0;
  dataRecord *local_a8;
  dataRecord *local_a0;
  baseType local_78;
  undefined1 local_70 [32];
  TimeRepresentation<count_time<9,_long>_> local_50;
  TimeRepresentation<count_time<9,_long>_> local_48;
  undefined8 local_40;
  byte local_35;
  int local_34;
  TimeRepresentation<count_time<9,_long>_> local_18;
  undefined8 local_c;
  byte local_1;
  
  local_18.internalTimeCode = in_RDX;
  local_c = in_RSI;
  bVar2 = std::__shared_ptr::operator_cast_to_bool(in_R8);
  if (!bVar2) {
    local_1 = 0;
    goto LAB_005a0187;
  }
  local_35 = 0;
  for (local_34 = 0; iVar1 = local_34,
      sVar3 = std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::size
                        ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                         (in_RDI + 0xb0)), iVar1 < (int)sVar3; local_34 = local_34 + 1) {
    std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::operator[]
              ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
               (in_RDI + 0xb0),(long)local_34);
    local_40 = local_c;
    id.handle.hid._3_1_ = in_stack_fffffffffffffec7;
    id._0_7_ = in_stack_fffffffffffffec0;
    bVar2 = GlobalHandle::operator==((GlobalHandle *)in_stack_fffffffffffffeb8._M_current,id);
    if (bVar2) {
      rhs = std::
            vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
            ::operator[]((vector<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                          *)(in_RDI + 200),(long)local_34);
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>(&local_18,rhs);
      if (bVar2) {
        local_1 = 0;
        goto LAB_005a0187;
      }
      local_35 = 1;
      break;
    }
  }
  if ((local_35 & 1) == 0) {
    local_1 = 0;
    goto LAB_005a0187;
  }
  std::
  vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
  ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                *)(in_RDI + 0x110),(long)local_34);
  bVar2 = std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
          ::empty((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                   *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  if (bVar2) {
    this_00 = (__shared_ptr *)
              std::
              vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
              ::operator[]((vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                            *)(in_RDI + 0x98),(long)local_34);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (bVar2) {
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                        ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x78),
                         (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
      if (bVar2) {
        std::
        vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
        ::operator[]((vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
                      *)(in_RDI + 0x80),(long)local_34);
        local_48 = TimeRepresentation<count_time<9,_long>_>::operator-
                             (&(in_stack_fffffffffffffeb8._M_current)->time,
                              (TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffeb0)
        ;
        bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<
                          (&local_48,(TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x78));
        if (bVar2) {
          local_1 = 0;
          goto LAB_005a0187;
        }
      }
      if ((*(byte *)(in_RDI + 0x6b) & 1) != 0) {
        std::
        vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
        ::operator[]((vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                      *)(in_RDI + 0x98),(long)local_34);
        std::
        __shared_ptr_access<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*(in_stack_fffffffffffffeb0);
        std::
        __shared_ptr_access<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*(in_stack_fffffffffffffeb0);
        bVar2 = helics::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        if (bVar2) {
          local_1 = 0;
          goto LAB_005a0187;
        }
      }
    }
    std::
    vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
    ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                  *)(in_RDI + 0x110),(long)local_34);
    std::vector<helics::InputInfo::dataRecord,std::allocator<helics::InputInfo::dataRecord>>::
    emplace_back<TimeRepresentation<count_time<9,long>>&,unsigned_int&,std::shared_ptr<helics::SmallBuffer_const>>
              ((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                *)in_stack_fffffffffffffed0,
               (TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffec8,
               (uint *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (shared_ptr<const_helics::SmallBuffer> *)in_stack_fffffffffffffeb8._M_current);
  }
  else {
    std::
    vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
    ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                  *)(in_RDI + 0x110),(long)local_34);
    rhs_00 = std::
             vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
             back((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                   *)in_stack_fffffffffffffeb0);
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>(&local_18,&rhs_00->time);
    if (bVar2) {
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                        ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x78),
                         (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
      if (bVar2) {
        std::
        vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
        ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                      *)(in_RDI + 0x110),(long)local_34);
        std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
        back((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
              *)in_stack_fffffffffffffeb0);
        local_50 = TimeRepresentation<count_time<9,_long>_>::operator-
                             (&(in_stack_fffffffffffffeb8._M_current)->time,
                              (TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffeb0)
        ;
        bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<
                          (&local_50,(TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x78));
        if (bVar2) {
          local_1 = 0;
          goto LAB_005a0187;
        }
      }
      if ((*(byte *)(in_RDI + 0x6b) & 1) != 0) {
        std::
        vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
        ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                      *)(in_RDI + 0x110),(long)local_34);
        std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
        back((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
              *)in_stack_fffffffffffffeb0);
        std::
        __shared_ptr_access<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*(in_stack_fffffffffffffeb0);
        std::
        __shared_ptr_access<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*(in_stack_fffffffffffffeb0);
        bVar2 = helics::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        if (bVar2) {
          local_1 = 0;
          goto LAB_005a0187;
        }
      }
      std::
      vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
      ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                    *)(in_RDI + 0x110),(long)local_34);
      std::vector<helics::InputInfo::dataRecord,std::allocator<helics::InputInfo::dataRecord>>::
      emplace_back<TimeRepresentation<count_time<9,long>>&,unsigned_int&,std::shared_ptr<helics::SmallBuffer_const>>
                ((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                  *)in_stack_fffffffffffffed0,
                 (TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffec8,
                 (uint *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (shared_ptr<const_helics::SmallBuffer> *)in_stack_fffffffffffffeb8._M_current);
    }
    else {
      local_78 = local_18.internalTimeCode;
      std::shared_ptr<const_helics::SmallBuffer>::shared_ptr
                ((shared_ptr<const_helics::SmallBuffer> *)in_stack_fffffffffffffeb0,
                 (shared_ptr<const_helics::SmallBuffer> *)in_stack_fffffffffffffea8);
      recordTime.internalTimeCode._7_1_ = in_stack_fffffffffffffec7;
      recordTime.internalTimeCode._0_7_ = in_stack_fffffffffffffec0;
      dataRecord::dataRecord
                (in_stack_fffffffffffffeb8._M_current,recordTime,
                 (uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                 (shared_ptr<const_helics::SmallBuffer> *)in_stack_fffffffffffffea8);
      std::shared_ptr<const_helics::SmallBuffer>::~shared_ptr
                ((shared_ptr<const_helics::SmallBuffer> *)0x59fee6);
      sb2 = (SmallBuffer *)(in_RDI + 0x110);
      std::
      vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
      ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                    *)sb2,(long)local_34);
      local_a8 = (dataRecord *)
                 std::
                 vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                 ::begin(in_stack_fffffffffffffea8);
      std::
      vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
      ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                    *)sb2,(long)local_34);
      local_b0 = (dataRecord *)
                 std::
                 vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                 ::end(in_stack_fffffffffffffea8);
      sb1 = std::
            upper_bound<__gnu_cxx::__normal_iterator<helics::InputInfo::dataRecord*,std::vector<helics::InputInfo::dataRecord,std::allocator<helics::InputInfo::dataRecord>>>,helics::InputInfo::dataRecord,helics::__1>
                      (local_a8,local_b0,local_70);
      local_a0 = sb1._M_current;
      std::
      vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
      ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                    *)(in_RDI + 0x110),(long)local_34);
      local_c0 = (dataRecord *)
                 std::
                 vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                 ::begin(in_stack_fffffffffffffea8);
      bVar2 = __gnu_cxx::
              operator==<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                        ((__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                          *)in_stack_fffffffffffffeb0,
                         (__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                          *)in_stack_fffffffffffffea8);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_005a00fe:
        __x = (value_type *)
              std::
              vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
              ::operator[]((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                            *)(in_RDI + 0x110),(long)local_34);
        __gnu_cxx::
        __normal_iterator<helics::InputInfo::dataRecord_const*,std::vector<helics::InputInfo::dataRecord,std::allocator<helics::InputInfo::dataRecord>>>
        ::__normal_iterator<helics::InputInfo::dataRecord*>
                  ((__normal_iterator<const_helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                    *)in_stack_fffffffffffffeb0,
                   (__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                    *)__x);
        std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
        insert((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,__x);
        bVar2 = false;
      }
      else {
        local_c8._M_current = local_a0;
        __gnu_cxx::
        __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
        ::operator--(&local_c8);
        bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                          ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x78),
                           (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
        if (!bVar2) {
LAB_005a0092:
          if ((*(byte *)(in_RDI + 0x6b) & 1) != 0) {
            __gnu_cxx::
            __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
            ::operator->(&local_c8);
            in_stack_fffffffffffffeb8._M_current =
                 (dataRecord *)
                 std::
                 __shared_ptr_access<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(in_stack_fffffffffffffeb0);
            std::
            __shared_ptr_access<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*(in_stack_fffffffffffffeb0);
            bVar2 = helics::operator==((SmallBuffer *)sb1._M_current,sb2);
            if (bVar2) {
              local_1 = 0;
              bVar2 = true;
              goto LAB_005a015f;
            }
          }
          goto LAB_005a00fe;
        }
        __gnu_cxx::
        __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
        ::operator->(&local_c8);
        local_d0 = TimeRepresentation<count_time<9,_long>_>::operator-
                             (&(in_stack_fffffffffffffeb8._M_current)->time,
                              (TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffeb0)
        ;
        bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<
                          (&local_d0,(TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x78));
        if (!bVar2) goto LAB_005a0092;
        local_1 = 0;
        bVar2 = true;
      }
LAB_005a015f:
      dataRecord::~dataRecord((dataRecord *)0x5a016c);
      if (bVar2) goto LAB_005a0187;
    }
  }
  local_1 = 1;
LAB_005a0187:
  return (bool)(local_1 & 1);
}

Assistant:

bool InputInfo::addData(GlobalHandle source_id,
                        Time valueTime,
                        unsigned int iteration,
                        std::shared_ptr<const SmallBuffer> data)
{
    if (!data) {
        return false;
    }
    int index;
    bool found = false;
    for (index = 0; index < static_cast<int>(input_sources.size()); ++index) {
        if (input_sources[index] == source_id) {
            if (valueTime > deactivated[index]) {
                return false;
            }
            found = true;
            break;
        }
    }
    if (!found) {
        return false;
    }
    if (data_queues[index].empty()) {
        if (current_data[index]) {
            if (minTimeGap > timeZero) {
                if ((valueTime - current_data_time[index].first) < minTimeGap) {
                    return false;
                }
            }
            if (only_update_on_change) {
                if (*current_data[index] == *data) {
                    return false;
                }
            }
        }
        data_queues[index].emplace_back(valueTime, iteration, std::move(data));
    } else if (valueTime > data_queues[index].back().time) {
        if (minTimeGap > timeZero) {
            if ((valueTime - data_queues[index].back().time) < minTimeGap) {
                return false;
            }
        }
        if (only_update_on_change) {
            if (*data_queues[index].back().data == *data) {
                return false;
            }
        }
        data_queues[index].emplace_back(valueTime, iteration, std::move(data));
    } else {
        dataRecord newRecord(valueTime, iteration, std::move(data));
        auto m = std::upper_bound(data_queues[index].begin(),
                                  data_queues[index].end(),
                                  newRecord,
                                  recordComparison);
        if (m != data_queues[index].begin()) {
            auto prev = m;
            --prev;
            if (minTimeGap > timeZero) {
                if ((valueTime - prev->time) < minTimeGap) {
                    return false;
                }
            }
            if (only_update_on_change) {
                if (*prev->data == *newRecord.data) {
                    return false;
                }
            }
        }
        data_queues[index].insert(m, std::move(newRecord));
    }
    return true;
}